

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds04_playlist.cpp
# Opt level: O0

void __thiscall
CP::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::check
          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  ostream *poVar1;
  int local_1c;
  node *pnStack_18;
  int n;
  node *p;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_local
  ;
  
  pnStack_18 = this->mHeader;
  local_1c = (int)this->mSize + 1;
  while (local_1c != 0) {
    pnStack_18 = pnStack_18->next;
    local_1c = local_1c + -1;
  }
  if (pnStack_18 != this->mHeader) {
    poVar1 = std::operator<<((ostream *)&std::cout,"next POINTER ERROR");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  pnStack_18 = this->mHeader;
  local_1c = (int)this->mSize + 1;
  while (local_1c != 0) {
    pnStack_18 = pnStack_18->prev;
    local_1c = local_1c + -1;
  }
  if (pnStack_18 != this->mHeader) {
    poVar1 = std::operator<<((ostream *)&std::cout,"prev POINTER ERROR");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void check() {
      node* p;
      int n;
      p = mHeader;
      n = mSize+1;
      while (n--) p = p->next;
      if (p != mHeader) {
        std::cout << "next POINTER ERROR" << std::endl;
      }
      p = mHeader;
      n = mSize+1;
      while (n--) p = p->prev;
      if (p != mHeader) {
        std::cout << "prev POINTER ERROR" << std::endl;
      }
    }